

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f *wo,Vector3f *wm)

{
  undefined1 auVar1 [16];
  Float FVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  FVar2 = D(this,wm);
  FVar3 = Lambda(this,wo);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)((wo->super_Tuple3<pbrt::Vector3,_float>).y *
                                         (wm->super_Tuple3<pbrt::Vector3,_float>).y)),
                           ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).x),
                           ZEXT416((uint)(wm->super_Tuple3<pbrt::Vector3,_float>).x));
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar4 = ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar1 = vfmadd231ss_fma(auVar1,auVar4,ZEXT416((uint)(wm->super_Tuple3<pbrt::Vector3,_float>).z));
  auVar1 = vandps_avx(auVar1,auVar5);
  auVar4 = vandps_avx(auVar4,auVar5);
  return ((1.0 / (FVar3 + 1.0)) * FVar2 * auVar1._0_4_) / auVar4._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const Vector3f &wo, const Vector3f &wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }